

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroupPrivate::applyGroupState
          (QParallelAnimationGroupPrivate *this,QAbstractAnimation *animation)

{
  parameter_type pVar1;
  
  pVar1 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.state);
  if (pVar1 == Paused) {
    QAbstractAnimation::pause((QAbstractAnimation *)animation);
    return;
  }
  if (pVar1 == Running) {
    QAbstractAnimation::start((QAbstractAnimation *)animation,KeepWhenStopped);
    return;
  }
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::applyGroupState(QAbstractAnimation *animation)
{
    switch (state)
    {
    case QAbstractAnimation::Running:
        animation->start();
        break;
    case QAbstractAnimation::Paused:
        animation->pause();
        break;
    case QAbstractAnimation::Stopped:
    default:
        break;
    }
}